

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3PoslistPhraseMerge(char **pp,int nToken,int isSaveLeft,int isExact,char **pp1,char **pp2)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  byte bVar9;
  char *pEnd_1;
  byte *pbVar10;
  long lVar11;
  long lVar12;
  char *pEnd_2;
  long lVar13;
  byte *pbVar14;
  byte *pbVar15;
  char *pEnd;
  byte *pbVar16;
  long lVar17;
  int iCol1;
  int iCol2;
  uchar *q;
  sqlite3_int64 iVal;
  int local_80;
  int local_7c;
  byte *local_78;
  long local_70;
  int local_64;
  char **local_60;
  char **local_58;
  char **local_50;
  byte *local_48;
  int local_3c;
  long local_38;
  
  local_78 = (byte *)*pp;
  pbVar10 = (byte *)*pp1;
  pbVar16 = (byte *)*pp2;
  local_80 = 0;
  local_7c = 0;
  local_64 = isSaveLeft;
  local_3c = isExact;
  if (*pbVar10 == 1) {
    if ((char)pbVar10[1] < '\0') {
      uVar4 = sqlite3Fts3GetVarint32((char *)(pbVar10 + 1),&local_80);
      uVar6 = (ulong)uVar4;
    }
    else {
      uVar6 = 1;
      local_80 = (int)(char)pbVar10[1];
    }
    pbVar10 = pbVar10 + 1 + uVar6;
  }
  if (*pbVar16 == 1) {
    if ((char)pbVar16[1] < '\0') {
      uVar4 = sqlite3Fts3GetVarint32((char *)(pbVar16 + 1),&local_7c);
      uVar6 = (ulong)uVar4;
    }
    else {
      uVar6 = 1;
      local_7c = (int)(char)pbVar16[1];
    }
    pbVar16 = pbVar16 + 1 + uVar6;
  }
  local_38 = (long)nToken;
  iVar5 = local_80;
  do {
    while (iVar5 != local_7c) {
      if (iVar5 < local_7c) {
        bVar8 = *pbVar10;
        if (1 < bVar8) {
          do {
            bVar9 = bVar8 & 0x80;
            bVar8 = pbVar10[1];
            pbVar10 = pbVar10 + 1;
          } while ((bVar8 & 0xfe) != 0 || bVar9 != 0);
        }
        if (bVar8 == 0) {
          bVar9 = *pbVar16;
          local_60 = pp;
          local_58 = pp1;
          local_50 = pp2;
LAB_0017f52a:
          pp = local_60;
          pp1 = local_58;
          pp2 = local_50;
          if (bVar9 != 0) {
            do {
              pbVar14 = pbVar16 + 1;
              pbVar16 = pbVar16 + 1;
              bVar8 = bVar9 & 0x80;
              bVar9 = *pbVar14;
            } while (bVar8 != 0 || *pbVar14 != 0);
          }
LAB_0017f542:
          bVar8 = *pbVar10;
          pbVar16 = pbVar16 + 1;
          if (bVar8 != 0) {
LAB_0017f54e:
            do {
              pbVar14 = pbVar10 + 1;
              pbVar10 = pbVar10 + 1;
              bVar9 = bVar8 & 0x80;
              bVar8 = *pbVar14;
            } while (bVar9 != 0 || *pbVar14 != 0);
          }
          *pp1 = (char *)(pbVar10 + 1);
          *pp2 = (char *)pbVar16;
          pbVar10 = (byte *)*pp;
          if (pbVar10 != local_78) {
            *local_78 = 0;
            *pp = (char *)(local_78 + 1);
          }
          return (uint)(pbVar10 != local_78);
        }
        if ((char)pbVar10[1] < '\0') {
          uVar4 = sqlite3Fts3GetVarint32((char *)(pbVar10 + 1),&local_80);
          uVar6 = (ulong)uVar4;
        }
        else {
          uVar6 = 1;
          local_80 = (int)(char)pbVar10[1];
        }
        pbVar10 = pbVar10 + 1 + uVar6;
        iVar5 = local_80;
      }
      else {
        bVar8 = *pbVar16;
        if (1 < bVar8) {
          do {
            bVar9 = bVar8 & 0x80;
            bVar8 = pbVar16[1];
            pbVar16 = pbVar16 + 1;
          } while ((bVar8 & 0xfe) != 0 || bVar9 != 0);
        }
        if (bVar8 == 0) goto LAB_0017f542;
        if ((char)pbVar16[1] < '\0') {
          uVar4 = sqlite3Fts3GetVarint32((char *)(pbVar16 + 1),&local_7c);
          uVar6 = (ulong)uVar4;
        }
        else {
          uVar6 = 1;
          local_7c = (int)(char)pbVar16[1];
        }
        pbVar16 = pbVar16 + 1 + uVar6;
      }
    }
    pbVar14 = local_78;
    if (iVar5 != 0) {
      *local_78 = 1;
      uVar6 = (long)local_80;
      pbVar14 = local_78 + 1;
      do {
        pbVar15 = pbVar14;
        bVar8 = (byte)uVar6;
        *pbVar15 = bVar8 | 0x80;
        pbVar14 = pbVar15 + 1;
        bVar2 = 0x7f < uVar6;
        uVar6 = uVar6 >> 7;
      } while (bVar2);
      *pbVar15 = bVar8;
    }
    local_60 = pp;
    local_58 = pp1;
    local_50 = pp2;
    iVar5 = sqlite3Fts3GetVarint((char *)pbVar10,&local_70);
    lVar13 = local_70;
    local_48 = pbVar10 + iVar5;
    iVar5 = sqlite3Fts3GetVarint((char *)pbVar16,&local_70);
    pbVar16 = pbVar16 + iVar5;
    lVar17 = local_70 + -2;
    lVar11 = 0;
    while( true ) {
      lVar13 = lVar13 + -2;
      lVar1 = lVar13 + local_38;
      while( true ) {
        pbVar10 = local_48;
        pp2 = local_50;
        pp1 = local_58;
        if ((lVar17 == lVar1) || (((lVar17 <= lVar1 && (local_3c == 0)) && (lVar13 < lVar17)))) {
          lVar12 = lVar13;
          if (local_64 == 0) {
            lVar12 = lVar17;
          }
          uVar6 = (lVar12 - lVar11) + 2;
          do {
            pbVar15 = pbVar14;
            bVar8 = (byte)uVar6;
            *pbVar15 = bVar8 | 0x80;
            pbVar14 = pbVar15 + 1;
            bVar2 = 0x7f < uVar6;
            uVar6 = uVar6 >> 7;
          } while (bVar2);
          *pbVar15 = bVar8;
          local_78 = (byte *)0x0;
          lVar11 = lVar12;
        }
        if ((lVar13 < lVar17) && (local_64 != 0 || lVar1 < lVar17)) break;
        if (*pbVar16 < 2) {
          bVar8 = *local_48;
          if (local_78 == (byte *)0x0) {
            local_78 = pbVar14;
          }
          if (1 < bVar8) {
            do {
              bVar9 = bVar8 & 0x80;
              bVar8 = pbVar10[1];
              pbVar10 = pbVar10 + 1;
            } while ((bVar8 & 0xfe) != 0 || bVar9 != 0);
          }
          goto LAB_0017f434;
        }
        iVar5 = sqlite3Fts3GetVarint((char *)pbVar16,&local_70);
        pbVar16 = pbVar16 + iVar5;
        lVar17 = lVar17 + local_70 + -2;
      }
      bVar8 = *local_48;
      if (bVar8 < 2) break;
      iVar5 = sqlite3Fts3GetVarint((char *)local_48,&local_70);
      local_48 = pbVar10 + iVar5;
      lVar13 = lVar13 + local_70;
    }
    if (local_78 == (byte *)0x0) {
      local_78 = pbVar14;
    }
LAB_0017f434:
    bVar9 = *pbVar16;
    if (1 < bVar9) {
      do {
        bVar3 = bVar9 & 0x80;
        bVar9 = pbVar16[1];
        pbVar16 = pbVar16 + 1;
      } while ((bVar9 & 0xfe) != 0 || bVar3 != 0);
    }
    if (bVar8 == 0) goto LAB_0017f52a;
    if (bVar9 == 0) {
      pbVar16 = pbVar16 + 1;
      pp = local_60;
      goto LAB_0017f54e;
    }
    if ((char)pbVar10[1] < '\0') {
      uVar4 = sqlite3Fts3GetVarint32((char *)(pbVar10 + 1),&local_80);
      uVar6 = (ulong)uVar4;
    }
    else {
      uVar6 = 1;
      local_80 = (int)(char)pbVar10[1];
    }
    if ((char)pbVar16[1] < '\0') {
      uVar4 = sqlite3Fts3GetVarint32((char *)(pbVar16 + 1),&local_7c);
      uVar7 = (ulong)uVar4;
    }
    else {
      uVar7 = 1;
      local_7c = (int)(char)pbVar16[1];
    }
    pbVar10 = pbVar10 + 1 + uVar6;
    pbVar16 = pbVar16 + 1 + uVar7;
    iVar5 = local_80;
    pp = local_60;
  } while( true );
}

Assistant:

static int fts3PoslistPhraseMerge(
  char **pp,                      /* IN/OUT: Preallocated output buffer */
  int nToken,                     /* Maximum difference in token positions */
  int isSaveLeft,                 /* Save the left position */
  int isExact,                    /* If *pp1 is exactly nTokens before *pp2 */
  char **pp1,                     /* IN/OUT: Left input list */
  char **pp2                      /* IN/OUT: Right input list */
){
  char *p = *pp;
  char *p1 = *pp1;
  char *p2 = *pp2;
  int iCol1 = 0;
  int iCol2 = 0;

  /* Never set both isSaveLeft and isExact for the same invocation. */
  assert( isSaveLeft==0 || isExact==0 );

  assert( p!=0 && *p1!=0 && *p2!=0 );
  if( *p1==POS_COLUMN ){ 
    p1++;
    p1 += fts3GetVarint32(p1, &iCol1);
  }
  if( *p2==POS_COLUMN ){ 
    p2++;
    p2 += fts3GetVarint32(p2, &iCol2);
  }

  while( 1 ){
    if( iCol1==iCol2 ){
      char *pSave = p;
      sqlite3_int64 iPrev = 0;
      sqlite3_int64 iPos1 = 0;
      sqlite3_int64 iPos2 = 0;

      if( iCol1 ){
        *p++ = POS_COLUMN;
        p += sqlite3Fts3PutVarint(p, iCol1);
      }

      assert( *p1!=POS_END && *p1!=POS_COLUMN );
      assert( *p2!=POS_END && *p2!=POS_COLUMN );
      fts3GetDeltaVarint(&p1, &iPos1); iPos1 -= 2;
      fts3GetDeltaVarint(&p2, &iPos2); iPos2 -= 2;

      while( 1 ){
        if( iPos2==iPos1+nToken 
         || (isExact==0 && iPos2>iPos1 && iPos2<=iPos1+nToken) 
        ){
          sqlite3_int64 iSave;
          iSave = isSaveLeft ? iPos1 : iPos2;
          fts3PutDeltaVarint(&p, &iPrev, iSave+2); iPrev -= 2;
          pSave = 0;
          assert( p );
        }
        if( (!isSaveLeft && iPos2<=(iPos1+nToken)) || iPos2<=iPos1 ){
          if( (*p2&0xFE)==0 ) break;
          fts3GetDeltaVarint(&p2, &iPos2); iPos2 -= 2;
        }else{
          if( (*p1&0xFE)==0 ) break;
          fts3GetDeltaVarint(&p1, &iPos1); iPos1 -= 2;
        }
      }

      if( pSave ){
        assert( pp && p );
        p = pSave;
      }

      fts3ColumnlistCopy(0, &p1);
      fts3ColumnlistCopy(0, &p2);
      assert( (*p1&0xFE)==0 && (*p2&0xFE)==0 );
      if( 0==*p1 || 0==*p2 ) break;

      p1++;
      p1 += fts3GetVarint32(p1, &iCol1);
      p2++;
      p2 += fts3GetVarint32(p2, &iCol2);
    }

    /* Advance pointer p1 or p2 (whichever corresponds to the smaller of
    ** iCol1 and iCol2) so that it points to either the 0x00 that marks the
    ** end of the position list, or the 0x01 that precedes the next 
    ** column-number in the position list. 
    */
    else if( iCol1<iCol2 ){
      fts3ColumnlistCopy(0, &p1);
      if( 0==*p1 ) break;
      p1++;
      p1 += fts3GetVarint32(p1, &iCol1);
    }else{
      fts3ColumnlistCopy(0, &p2);
      if( 0==*p2 ) break;
      p2++;
      p2 += fts3GetVarint32(p2, &iCol2);
    }
  }

  fts3PoslistCopy(0, &p2);
  fts3PoslistCopy(0, &p1);
  *pp1 = p1;
  *pp2 = p2;
  if( *pp==p ){
    return 0;
  }
  *p++ = 0x00;
  *pp = p;
  return 1;
}